

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

ulong __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::
PerformDefaultAction
          (FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this,
          ArgumentTuple *args,string *call_description)

{
  uint uVar1;
  OnCallSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this_00;
  pointer pcVar2;
  bool bVar3;
  Action<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this_01;
  ulong uVar4;
  runtime_error *this_02;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  string message;
  long *local_48 [2];
  long local_38 [2];
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar5 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001a779e;
    this_00 = (OnCallSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    bVar3 = OnCallSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::Matches(this_00,args);
  } while (!bVar3);
  if (this_00 != (OnCallSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)0x0) {
    this_01 = OnCallSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::GetAction(this_00);
    uVar4 = Action<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::Perform(this_01,args);
    return uVar4;
  }
LAB_001a779e:
  pcVar2 = (call_description->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_48);
  if (DefaultValue<BasicTestExpr<0>>::value_ != (uint *)0x0) {
    uVar1 = *DefaultValue<BasicTestExpr<0>>::value_;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    return (ulong)uVar1;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,(string *)local_48);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }